

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O0

int h264_mb_skip_flag(bitstream *str,h264_cabac_context *cabac,uint32_t *binVal)

{
  int iVar1;
  h264_macroblock *phVar2;
  h264_macroblock *phVar3;
  byte local_4a;
  byte local_49;
  int condTermFlagB;
  int condTermFlagA;
  h264_macroblock *mbB;
  h264_macroblock *mbA;
  int ctxIdxInc;
  int ctxIdxOffset;
  uint32_t *binVal_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  if (cabac == (h264_cabac_context *)0x0) {
    fprintf(_stderr,"mb_skip_flag used in CAVLC mode\n");
    str_local._4_4_ = 1;
  }
  else {
    if ((cabac->slice->slice_type == 0) || (cabac->slice->slice_type == 3)) {
      mbA._4_4_ = 0xb;
    }
    else {
      if (cabac->slice->slice_type != 1) {
        fprintf(_stderr,"mb_skip_flag used in I/SI slice\n");
        return 1;
      }
      mbA._4_4_ = 0x18;
    }
    phVar2 = h264_mb_nb(cabac->slice,H264_MB_A,0);
    phVar3 = h264_mb_nb(cabac->slice,H264_MB_B,0);
    local_49 = 0;
    if (phVar2->mb_type != 0x39) {
      iVar1 = h264_is_skip_mb_type(phVar2->mb_type);
      local_49 = iVar1 != 0 ^ 0xff;
    }
    local_4a = 0;
    if (phVar3->mb_type != 0x39) {
      iVar1 = h264_is_skip_mb_type(phVar3->mb_type);
      local_4a = iVar1 != 0 ^ 0xff;
    }
    str_local._4_4_ =
         h264_cabac_decision(str,cabac,mbA._4_4_ + (uint)(local_49 & 1) + (uint)(local_4a & 1),
                             binVal);
  }
  return str_local._4_4_;
}

Assistant:

int h264_mb_skip_flag(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t *binVal) {
	if (!cabac) {
		fprintf (stderr, "mb_skip_flag used in CAVLC mode\n");
		return 1;
	}
	int ctxIdxOffset, ctxIdxInc;
	if (cabac->slice->slice_type == H264_SLICE_TYPE_P || cabac->slice->slice_type == H264_SLICE_TYPE_SP) {
		ctxIdxOffset = H264_CABAC_CTXIDX_MB_SKIP_FLAG_P;
	} else if (cabac->slice->slice_type == H264_SLICE_TYPE_B) {
		ctxIdxOffset = H264_CABAC_CTXIDX_MB_SKIP_FLAG_B;
	} else {
		fprintf (stderr, "mb_skip_flag used in I/SI slice\n");
		return 1;
	}
	const struct h264_macroblock *mbA = h264_mb_nb(cabac->slice, H264_MB_A, 0);
	const struct h264_macroblock *mbB = h264_mb_nb(cabac->slice, H264_MB_B, 0);
	int condTermFlagA = (mbA->mb_type != H264_MB_TYPE_UNAVAIL && !h264_is_skip_mb_type(mbA->mb_type));
	int condTermFlagB = (mbB->mb_type != H264_MB_TYPE_UNAVAIL && !h264_is_skip_mb_type(mbB->mb_type));
	ctxIdxInc = condTermFlagA + condTermFlagB;
	return h264_cabac_decision(str, cabac, ctxIdxOffset+ctxIdxInc, binVal);
}